

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::multisample::MSInstance<vkt::pipeline::multisample::MSInstanceDistinctValues>::
uploadVertexData(MSInstance<vkt::pipeline::multisample::MSInstanceDistinctValues> *this,
                Allocation *vertexBufferAllocation,VertexDataDesc *vertexDataDescripton)

{
  pointer __src;
  vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  vertices;
  vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  local_48;
  VertexDataNdc local_28;
  
  local_48.
  super__Vector_base<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28.positionNdc.m_data[0] = -1.0;
  local_28.positionNdc.m_data[1] = -1.0;
  local_28.positionNdc.m_data[2] = 0.0;
  local_28.positionNdc.m_data[3] = 1.0;
  std::
  vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  ::emplace_back<vkt::pipeline::multisample::VertexDataNdc>(&local_48,&local_28);
  local_28.positionNdc.m_data[0] = -1.0;
  local_28.positionNdc.m_data[1] = 4.0;
  local_28.positionNdc.m_data[2] = 0.0;
  local_28.positionNdc.m_data[3] = 1.0;
  std::
  vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  ::emplace_back<vkt::pipeline::multisample::VertexDataNdc>(&local_48,&local_28);
  local_28.positionNdc.m_data[0] = 4.0;
  local_28.positionNdc.m_data[1] = -1.0;
  local_28.positionNdc.m_data[2] = 0.0;
  local_28.positionNdc.m_data[3] = 1.0;
  std::
  vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  ::emplace_back<vkt::pipeline::multisample::VertexDataNdc>(&local_48,&local_28);
  __src = (pointer)0x0;
  if (local_48.
      super__Vector_base<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_48.
      super__Vector_base<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __src = local_48.
            super__Vector_base<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
            ._M_impl.super__Vector_impl_data._M_start;
  }
  memcpy(vertexBufferAllocation->m_hostPtr,__src,vertexDataDescripton->dataSize);
  if (local_48.
      super__Vector_base<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MSInstance<MSInstanceDistinctValues>::uploadVertexData (const Allocation& vertexBufferAllocation, const VertexDataDesc& vertexDataDescripton) const
{
	std::vector<VertexDataNdc> vertices;

	vertices.push_back(VertexDataNdc(tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f)));
	vertices.push_back(VertexDataNdc(tcu::Vec4(-1.0f,  4.0f, 0.0f, 1.0f)));
	vertices.push_back(VertexDataNdc(tcu::Vec4( 4.0f, -1.0f, 0.0f, 1.0f)));

	deMemcpy(vertexBufferAllocation.getHostPtr(), dataPointer(vertices), static_cast<std::size_t>(vertexDataDescripton.dataSize));
}